

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O2

ChannelList *
anon_unknown.dwarf_1f70ea::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,char **passivechannels,
          PixelType *pt,FrameBuffer *buf,FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,
          bool writing)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  Box2i *pBVar7;
  size_t xst;
  size_t yst;
  long lVar8;
  bool bVar9;
  long *plVar10;
  char **ppcVar11;
  uint uVar12;
  int iVar13;
  PixelType PVar14;
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar15;
  pointer pcVar16;
  char *pcVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong local_c8;
  Slice local_68;
  
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar2 = (pBVar7->min).x;
  uVar3 = (pBVar7->min).y;
  uVar20 = (ulong)uVar3;
  iVar19 = (pBVar7->max).x;
  bVar25 = false;
  iVar6 = 0;
  for (uVar24 = 0; ppcVar11 = passivechannels, iVar18 = iVar6, local_c8 = uVar24, bVar5 = bVar25,
      channels[uVar24] != (char *)0x0; uVar24 = uVar24 + 1) {
    if (pt == (PixelType *)0x0) {
LAB_0016e585:
      iVar6 = iVar6 + 2;
    }
    else {
      PVar14 = pt[uVar24];
      if ((PVar14 != UINT) && (PVar14 != FLOAT)) {
        if (PVar14 == HALF) goto LAB_0016e585;
        goto LAB_0016e9d1;
      }
      iVar6 = iVar6 + (-iVar6 & 3U) + 4;
      bVar25 = true;
    }
  }
LAB_0016e5c1:
  iVar13 = iVar6;
  bVar9 = bVar25;
  if ((passivechannels == (char **)0x0) ||
     (iVar13 = iVar18, bVar9 = bVar5, *ppcVar11 == (char *)0x0)) goto LAB_0016e610;
  if (pt == (PixelType *)0x0) {
LAB_0016e5ee:
    iVar18 = iVar18 + 2;
  }
  else {
    PVar14 = pt[local_c8];
    if ((PVar14 != UINT) && (PVar14 != FLOAT)) {
      if (PVar14 == HALF) goto LAB_0016e5ee;
LAB_0016e9d1:
      std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
LAB_0016e9e4:
      exit(1);
    }
    iVar18 = iVar18 + (-iVar18 & 3U) + 4;
    bVar5 = true;
  }
  ppcVar11 = ppcVar11 + 1;
  local_c8 = local_c8 + 1;
  goto LAB_0016e5c1;
LAB_0016e610:
  uVar12 = -iVar13 & 3;
  if (!bVar9) {
    uVar12 = 0;
  }
  iVar13 = uVar12 + iVar13;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar6 = (pBVar7->max).x;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar18 = (iVar6 - (pBVar7->min).x) + 1;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar6 = (pBVar7->max).y;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar22 = (iVar6 - (pBVar7->min).y) + 1;
  iVar6 = (int)local_c8;
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,(long)(iVar22 * iVar13 * iVar18 * iVar6));
  pcVar15 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  iVar18 = iVar22 * iVar18 * iVar6;
  if (iVar18 < 1) {
    iVar18 = 0;
  }
  iVar22 = 0;
  while (bVar25 = iVar18 != 0, iVar18 = iVar18 + -1, bVar25) {
    uVar12 = random_int(0xffff);
    if ((pt == (PixelType *)0x0) || (pt[iVar22] == HALF)) {
      *(short *)pcVar15 = (short)uVar12;
      pcVar15 = pcVar15 + 2;
    }
    else {
      pcVar16 = pcVar15 + (-(int)pcVar15 & 3);
      pcVar15 = pcVar16 + 4;
      *(undefined4 *)pcVar16 = *(undefined4 *)((long)&half::_toFloat + (ulong)(uVar12 & 0xffff) * 4)
      ;
    }
    iVar22 = iVar22 + 1;
    if (iVar22 == iVar6) {
      iVar22 = 0;
    }
  }
  if (!writing) {
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)(anonymous_namespace)::preReadBuffer,
               (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer);
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar19 = iVar13 * ((iVar19 - iVar2) + 1);
  xst = (size_t)(iVar13 / banks);
  yst = (size_t)iVar19;
  ppcVar11 = passivechannels + -(long)(int)uVar24;
  uVar23 = 0;
  pcVar17 = (char *)0x0;
  do {
    if ((local_c8 & 0xffffffff) == uVar23) {
      return __return_storage_ptr__;
    }
    PVar14 = HALF;
    if (pt != (PixelType *)0x0) {
      PVar14 = pt[uVar23];
    }
    if (uVar23 < uVar24 && writing) {
      pcVar4 = channels[uVar23];
      Imf_2_5::Channel::Channel((Channel *)&local_68,PVar14,1,1,false);
      Imf_2_5::ChannelList::insert(__return_storage_ptr__,pcVar4,(Channel *)&local_68);
    }
    lVar8 = (long)(int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | local_c8 & 0xffffffff) /
                       (long)banks);
    uVar21 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
    if ((int)((long)uVar21 % lVar8) == 0) {
      plVar10 = &(anonymous_namespace)::readingBuffer;
      if (writing) {
        plVar10 = &(anonymous_namespace)::writingBuffer;
      }
      pcVar17 = (char *)(((long)((int)((long)uVar21 / lVar8) * (iVar19 / banks)) + *plVar10) -
                        (long)(int)(iVar2 * (iVar13 / banks) + uVar3 * iVar19));
    }
    uVar21 = (ulong)(-(int)pcVar17 & 3);
    if ((PVar14 & ~FLOAT) != UINT) {
      uVar21 = 0;
    }
    pcVar17 = pcVar17 + uVar21;
    if (uVar23 < uVar24) {
      pcVar4 = channels[uVar23];
      iVar18 = (int)uVar23 + 100;
      Imf_2_5::Slice::Slice
                (&local_68,PVar14,pcVar17,xst,yst,1,1,(double)iVar18,SUB81(uVar20,0),SUB41(iVar18,0)
                );
      Imf_2_5::FrameBuffer::insert(buf,pcVar4,&local_68);
    }
    else if (!writing) {
      pcVar4 = ppcVar11[uVar23];
      Imf_2_5::Slice::Slice
                (&local_68,PVar14,pcVar17,xst,yst,1,1,0.4,SUB81(uVar20,0),SUB81(ppcVar11,0));
      Imf_2_5::FrameBuffer::insert(postreadbuf,pcVar4,&local_68);
      pcVar4 = ppcVar11[uVar23];
      Imf_2_5::Slice::Slice
                (&local_68,PVar14,
                 pcVar17 + ((anonymous_namespace)::preReadBuffer._0_8_ -
                           (anonymous_namespace)::readingBuffer),xst,yst,1,1,0.4,SUB81(uVar20,0),
                 SUB81(ppcVar11,0));
      Imf_2_5::FrameBuffer::insert(prereadbuf,pcVar4,&local_68);
    }
    lVar8 = 2;
    if (PVar14 != HALF) {
      if (PVar14 != FLOAT) {
        std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
        goto LAB_0016e9e4;
      }
      lVar8 = 4;
    }
    pcVar17 = pcVar17 + lVar8;
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const char * const *passivechannels, // NULL terminated list of channels to write
             const PixelType* pt,     // type of each channel, or NULL for all HALF
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             FrameBuffer& prereadbuf, // channels which aren't being read - indexes into the preread buffer
             FrameBuffer& postreadbuf, // channels which aren't being read - indexes into the postread buffer
             int banks,                    // number of banks - channels within each bank are interleaved, banks are scanline interleaved
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    int activechans = 0;
    int bytes_per_pixel =0;
    bool has32BitValue = false;
    while (channels[activechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                    
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        activechans++;
    }

    
    int passivechans=0;
    while (passivechannels!=NULL && passivechannels[passivechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[passivechans+activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        passivechans++;
    }
    
    if(has32BitValue)
    {
        bytes_per_pixel = alignToFour(bytes_per_pixel);
    }

   int chans = activechans+passivechans;

    
    int bytes_per_bank = bytes_per_pixel/banks;
    
    int samples = (hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  (hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*chans;

    int size = samples*bytes_per_pixel;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels
     int chan=0;
     for (int i=0;i<samples;i++)
     {
         unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
         half v;
         v.setBits(values);
         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
             write_ptr+=2;
         }
         else
         {
             write_ptr = alignToFour(write_ptr);
             *(float*)write_ptr = float(v);
             
             write_ptr+=4;
         }
         chan++;
         if (chan==chans)
         {
             chan=0;
         }
     
     }

     if (!writing)
     {
         //take a copy of the buffer as it was before being read
         preReadBuffer = readingBuffer;
     }
     
    char* offset=NULL;

    ChannelList chanlist;

    int bytes_per_row = bytes_per_pixel*(dw.max.x+1-dw.min.x);
    int bytes_per_bank_row = bytes_per_row/banks;
    
    int first_pixel_index = bytes_per_row*dw.min.y+bytes_per_bank*dw.min.x;
    
    for (int i=0;i<chans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];
        if (i<activechans && writing)
        {
            chanlist.insert(channels[i],type);
        }


        if (i % (chans/banks) ==0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans/banks);
            offset = (writing ? &writingBuffer[0] :
                                &readingBuffer[0]) + bank*bytes_per_bank_row - first_pixel_index;
        }
       

         if(type==FLOAT || type==UINT)
         {
           offset = alignToFour(offset);
         }
 
        if (i<activechans)
        {
            
            buf.insert (channels[i],
                        Slice (type,
                               offset,
                               bytes_per_bank,
                               bytes_per_row,
                               1,1,100+i));
        }
        else
        {
            if (!writing)
            {
                
                postreadbuf.insert (passivechannels[i-activechans],
                                    Slice (type,
                                           offset,
                                           bytes_per_bank,
                                           bytes_per_row,
                                           1,1,0.4));

                char * pre_offset = offset-&readingBuffer[0]+&preReadBuffer[0];
 
                prereadbuf.insert (passivechannels[i-activechans],
                                   Slice (type,
                                          pre_offset,
                                          bytes_per_bank,
                                          bytes_per_row,
                                          1,1,0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF :
                offset+=2;
                break;
            case IMF::FLOAT :
                offset+=4;
                break;
            default :
                cout << "Unexpected Pixel Type\n";
                exit(1);
        
        }
    }

    return chanlist;
}